

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::init(arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
       *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  type tVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t sVar8;
  int in_EAX;
  uint i;
  entry *peVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (this->map_ != (entry *)0x0) {
    return in_EAX;
  }
  uVar10 = *(ulong *)ctx;
  uVar14 = 0xf;
  if ((long)uVar10 < 0) {
    uVar14 = uVar10 & 0xffffffff;
  }
  peVar9 = (entry *)operator_new__(uVar14 * 0x30);
  if ((int)uVar14 != 0) {
    uVar13 = 0;
    do {
      *(undefined4 *)((long)&(peVar9->arg).type_ + uVar13) = 0;
      puVar5 = (undefined8 *)((long)&(peVar9->name).data_ + uVar13);
      *puVar5 = 0;
      puVar5[1] = 0;
      *(undefined4 *)((long)&(peVar9->arg).value_.field_0 + uVar13) = 0;
      uVar13 = uVar13 + 0x30;
    } while (uVar14 * 0x30 != uVar13);
  }
  this->map_ = peVar9;
  if ((long)uVar10 < 0) {
    uVar10 = 0;
    do {
      iVar12 = *(int *)(*(long *)(ctx + 8) + 0x10 + uVar10 * 0x20);
      if (iVar12 == 1) {
        puVar5 = *(undefined8 **)(*(long *)(ctx + 8) + uVar10 * 0x20);
        iVar12 = *(int *)(puVar5 + 2);
        uVar1 = *(undefined4 *)((long)puVar5 + 0x1c);
        uVar6 = *(undefined8 *)((long)puVar5 + 0x14);
        tVar2 = *(type *)(puVar5 + 4);
        uVar3 = *(undefined4 *)((long)puVar5 + 0x2c);
        uVar7 = *(undefined8 *)((long)puVar5 + 0x24);
        peVar9 = this->map_;
        uVar4 = this->size_;
        sVar8 = puVar5[1];
        peVar9[uVar4].name.data_ = (wchar_t *)*puVar5;
        peVar9[uVar4].name.size_ = sVar8;
        peVar9[uVar4].arg.value_.field_0.int_value = iVar12;
        *(undefined4 *)((long)&peVar9[uVar4].arg.value_.field_0 + 0xc) = uVar1;
        *(undefined8 *)((long)&peVar9[uVar4].arg.value_.field_0.string.value + 4) = uVar6;
        peVar9[uVar4].arg.type_ = tVar2;
        *(undefined8 *)&peVar9[uVar4].arg.field_0x14 = uVar7;
        *(undefined4 *)&peVar9[uVar4].arg.field_0x1c = uVar3;
        this->size_ = this->size_ + 1;
      }
      else if (iVar12 == 0) {
        return (int)uVar10;
      }
      uVar10 = (ulong)((int)uVar10 + 1);
    } while( true );
  }
  bVar11 = 0;
  uVar10 = 0;
  do {
    iVar12 = (int)((0xfL << (bVar11 & 0x3f) & *(ulong *)ctx) >> (bVar11 & 0x3f));
    if (iVar12 == 1) {
      puVar5 = *(undefined8 **)(*(long *)(ctx + 8) + uVar10 * 0x10);
      iVar12 = *(int *)(puVar5 + 2);
      uVar1 = *(undefined4 *)((long)puVar5 + 0x1c);
      uVar6 = *(undefined8 *)((long)puVar5 + 0x14);
      tVar2 = *(type *)(puVar5 + 4);
      uVar3 = *(undefined4 *)((long)puVar5 + 0x2c);
      uVar7 = *(undefined8 *)((long)puVar5 + 0x24);
      peVar9 = this->map_;
      uVar4 = this->size_;
      sVar8 = puVar5[1];
      peVar9[uVar4].name.data_ = (wchar_t *)*puVar5;
      peVar9[uVar4].name.size_ = sVar8;
      peVar9[uVar4].arg.value_.field_0.int_value = iVar12;
      *(undefined4 *)((long)&peVar9[uVar4].arg.value_.field_0 + 0xc) = uVar1;
      *(undefined8 *)((long)&peVar9[uVar4].arg.value_.field_0.string.value + 4) = uVar6;
      peVar9[uVar4].arg.type_ = tVar2;
      *(undefined8 *)&peVar9[uVar4].arg.field_0x14 = uVar7;
      *(undefined4 *)&peVar9[uVar4].arg.field_0x1c = uVar3;
      this->size_ = this->size_ + 1;
    }
    else if (iVar12 == 0) {
      return (int)uVar10;
    }
    uVar10 = (ulong)((int)uVar10 + 1);
    bVar11 = bVar11 + 4;
  } while( true );
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context> &args) {
  if (map_)
    return;
  map_ = new entry[args.max_size()];
  if (args.is_packed()) {
    for (unsigned i = 0;/*nothing*/; ++i) {
      internal::type arg_type = args.type(i);
      switch (arg_type) {
        case internal::none_type:
          return;
        case internal::named_arg_type:
          push_back(args.values_[i]);
          break;
        default:
          break; // Do nothing.
      }
    }
  }
  for (unsigned i = 0; ; ++i) {
    switch (args.args_[i].type_) {
      case internal::none_type:
        return;
      case internal::named_arg_type:
        push_back(args.args_[i].value_);
        break;
      default:
        break; // Do nothing.
    }
  }
}